

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

BBox * __thiscall CMU462::Edge::bounds(BBox *__return_storage_ptr__,Edge *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  BBox local_60;
  
  (__return_storage_ptr__->max).x = 0.0;
  (__return_storage_ptr__->max).y = 0.0;
  (__return_storage_ptr__->max).z = 0.0;
  (__return_storage_ptr__->min).x = 0.0;
  (__return_storage_ptr__->min).y = 0.0;
  (__return_storage_ptr__->min).z = 0.0;
  (__return_storage_ptr__->extent).x = 0.0;
  (__return_storage_ptr__->extent).y = 0.0;
  (__return_storage_ptr__->max).x = -INFINITY;
  (__return_storage_ptr__->max).y = -INFINITY;
  (__return_storage_ptr__->max).z = -INFINITY;
  (__return_storage_ptr__->min).x = INFINITY;
  (__return_storage_ptr__->min).y = INFINITY;
  (__return_storage_ptr__->min).z = INFINITY;
  (__return_storage_ptr__->extent).x = -INFINITY;
  (__return_storage_ptr__->extent).y = -INFINITY;
  (__return_storage_ptr__->extent).z = -INFINITY;
  p_Var1 = (this->_halfedge)._M_node;
  p_Var2 = p_Var1[3]._M_prev;
  p_Var1 = p_Var1[1]._M_prev[3]._M_prev;
  if (*(char *)&p_Var2[0xc]._M_next == '\0') {
    (*(code *)(p_Var2[1]._M_next)->_M_prev)(&local_60,p_Var2 + 1);
    BBox::expand(__return_storage_ptr__,&local_60);
  }
  if (*(char *)&p_Var1[0xc]._M_next == '\0') {
    (*(code *)(p_Var1[1]._M_next)->_M_prev)(&local_60,p_Var1 + 1);
    BBox::expand(__return_storage_ptr__,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Edge::bounds() const
  {
    BBox box;

    FaceCIter f0 = halfedge()->face();
    FaceCIter f1 = halfedge()->twin()->face();

    if( !f0->isBoundary() ) box.expand( f0->bounds() );
    if( !f1->isBoundary() ) box.expand( f1->bounds() );

    return box;
  }